

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

double cm_secdiff(timespec clock1,timespec clock0)

{
  long lVar1;
  timespec time1;
  __syscall_slong_t in_RCX;
  __time_t in_RDX;
  __syscall_slong_t in_RSI;
  __time_t in_RDI;
  long in_FS_OFFSET;
  timespec tVar2;
  double ret;
  timespec diff;
  undefined8 local_28;
  undefined8 uStack_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  time1.tv_nsec = in_RSI;
  time1.tv_sec = in_RDI;
  tVar2.tv_nsec = in_RCX;
  tVar2.tv_sec = in_RDX;
  tVar2 = cm_tspecdiff(time1,tVar2);
  local_28 = tVar2.tv_sec;
  uStack_20 = tVar2.tv_nsec;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (double)local_28 + (double)uStack_20 / 1000000000.0;
  }
  __stack_chk_fail();
}

Assistant:

static double cm_secdiff(struct timespec clock1, struct timespec clock0)
{
    double ret;
    struct timespec diff;

    diff = cm_tspecdiff(clock1, clock0);

    ret = diff.tv_sec;
    ret += (double) diff.tv_nsec / (double) 1E9;

    return ret;
}